

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve.c
# Opt level: O3

int resolve_instid(lyd_node *data,char *path,int req_inst,lyd_node **ret)

{
  byte bVar1;
  undefined8 *puVar2;
  ly_ctx *sleaf;
  lys_node *plVar3;
  long lVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  lys_node *plVar8;
  lys_module *plVar9;
  lyd_node *plVar10;
  lyd_node *plVar11;
  ushort **ppuVar12;
  char *pcVar13;
  void *pvVar14;
  lyd_node *extraout_RAX;
  lys_type *plVar15;
  char *pcVar16;
  LY_VLOG_ELEM elem_type;
  int ignore_fail;
  lys_module *plVar17;
  long lVar18;
  size_t sVar19;
  LY_ECODE ecode;
  LYS_NODE LVar20;
  int iVar21;
  lys_ident *plVar22;
  char *pcVar23;
  ushort *puVar24;
  int iVar25;
  uint uVar26;
  ulong uVar27;
  char *pcVar28;
  lys_node *plVar29;
  hash_table *phVar30;
  long lVar31;
  hash_table *phVar32;
  int iVar33;
  ulong uVar34;
  ulong uVar35;
  char cVar36;
  lyd_node *plStack_150;
  lys_module *plStack_148;
  hash_table *phStack_140;
  size_t sStack_138;
  code *pcStack_130;
  lys_node *local_f8;
  char *model;
  int local_e8;
  int local_e4;
  undefined1 local_e0 [8];
  char *name;
  lys_node *local_d0;
  int local_c8;
  int local_c4;
  int mod_len;
  lys_node *local_b8;
  lyd_node *local_b0;
  hash_table *local_a8;
  lyd_node *local_a0;
  ushort **local_98;
  ulong local_90;
  ly_ctx *local_88;
  lys_module *local_80;
  int local_74;
  char *local_70;
  lys_node *local_68;
  lys_node *local_60;
  int local_54;
  ulong local_50;
  lys_module *local_48;
  lyd_node *local_40;
  void *local_38;
  
  local_80 = (lys_module *)data->schema->module->ctx;
  *ret = (lyd_node *)0x0;
  plVar3 = (lys_node *)data;
  do {
    plVar8 = plVar3;
    plVar3 = (lys_node *)plVar8->iffeature;
  } while ((lys_node *)plVar8->iffeature != (lys_node *)0x0);
  plVar10 = (lyd_node *)plVar8->ext;
  plVar3 = plVar8;
  while (plVar29 = plVar8, plVar10 != (lyd_node *)0x0) {
    plVar8 = (lys_node *)plVar29->ext;
    plVar10 = *(lyd_node **)&plVar8->flags;
    plVar3 = plVar29;
  }
  local_e8 = -(int)path;
  local_d0 = (lys_node *)0x0;
  plVar10 = (lyd_node *)0x0;
  uVar27 = 0;
  plVar17 = (lys_module *)0x0;
  uVar34 = 0;
  pcVar16 = (char *)plVar3;
  phVar30 = (hash_table *)path;
  local_e4 = req_inst;
  local_b0 = data;
  local_a8 = (hash_table *)path;
  do {
    cVar36 = *(char *)((long)&phVar30->used + (uVar34 & 0xffffffff));
    phVar32 = phVar30;
    local_50 = uVar27;
    local_40 = plVar10;
    if (cVar36 != '/') {
      uVar6 = 0;
      if (cVar36 == '\0') {
        uVar6 = (uint)uVar27;
LAB_0011be70:
        if (uVar6 == 1) {
          *ret = (lyd_node *)local_40->schema;
          pcStack_130 = (code *)0x11bec7;
          free(local_40);
          return 0;
        }
        if (uVar6 == 0) {
LAB_0011be7b:
          if (local_e4 < 0) {
            pcStack_130 = (code *)0x11bf2c;
            ly_log((ly_ctx *)0x0,LY_LLVRB,LY_SUCCESS,
                   "There is no instance of \"%s\", but it is not required.",phVar30);
            return 0;
          }
          pcStack_130 = (code *)0x11bea7;
          ly_vlog((ly_ctx *)local_80,LYE_NOREQINS,LY_VLOG_LYD,local_b0,phVar30);
          return 1;
        }
        pcStack_130 = (code *)0x11bef4;
        ly_vlog((ly_ctx *)local_80,LYE_TOOMANY,LY_VLOG_LYD,local_b0,phVar30,"data tree");
      }
      else {
LAB_0011bfd5:
        uVar34 = (ulong)((int)uVar34 - uVar6);
        pcStack_130 = (code *)0x11bffd;
        ly_vlog((ly_ctx *)local_80,LYE_INCHAR,LY_VLOG_LYD,local_b0,
                (ulong)(uint)(int)*(char *)((long)&phVar32->used + uVar34),
                (char *)((long)&phVar32->used + uVar34));
      }
LAB_0011bffd:
      pcStack_130 = (code *)0x11c006;
      free(local_40);
      return -1;
    }
    plVar8 = (lys_node *)((long)&phVar30->used + (uVar34 & 0xffffffff) + 1);
    pcStack_130 = (code *)0x11b1d3;
    uVar5 = parse_identifier((char *)plVar8);
    plVar9 = local_80;
    uVar6 = uVar5;
    if ((int)uVar5 < 1) goto LAB_0011bfd5;
    if (plVar8->padding[(ulong)uVar5 - 0x1c] == ':') {
      plVar29 = (lys_node *)(plVar8->padding + ((ulong)uVar5 - 0x1b));
      pcStack_130 = (code *)0x11b1fe;
      local_90 = uVar34;
      uVar6 = parse_identifier((char *)plVar29);
      sVar19 = (size_t)uVar6;
      phVar32 = local_a8;
      uVar34 = local_90;
      if ((int)uVar6 < 1) goto LAB_0011bfd5;
      local_a0 = (lyd_node *)CONCAT71(local_a0._1_7_,plVar29->padding[sVar19 - 0x1c] == '[');
      local_90 = (ulong)((int)local_90 + 2 + uVar5 + uVar6);
      local_d0 = plVar8;
      model._4_4_ = uVar5;
      local_60 = plVar29;
LAB_0011b271:
      pcStack_130 = (code *)0x11b286;
      plVar8 = (lys_node *)strndup((char *)local_d0,(long)(int)model._4_4_);
      plVar17 = local_80;
      if (plVar8 == (lys_node *)0x0) {
        pcStack_130 = (code *)0x11bf56;
        ly_log((ly_ctx *)local_80,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
               "resolve_instid");
        goto LAB_0011bffd;
      }
      pcVar16 = (char *)0x1;
      pcStack_130 = (code *)0x11b2a8;
      path = (char *)plVar8;
      plVar9 = ly_ctx_get_module((ly_ctx *)local_80,(char *)plVar8,(char *)0x0,1);
      if (plVar17->tpdf == (lys_tpdf *)0x0) {
LAB_0011b316:
        pcStack_130 = (code *)0x11b31e;
        free(plVar8);
        if (plVar9 == (lys_module *)0x0) {
          uVar6 = (uint)local_50;
          phVar30 = local_a8;
          goto LAB_0011be70;
        }
      }
      else {
        if (plVar9 == (lys_module *)0x0) {
          plVar22 = local_80->ident;
          pcVar23 = (char *)0x0;
          pcVar16 = (char *)0x0;
          path = (char *)plVar8;
LAB_0011b311:
          pcStack_130 = (code *)0x11b313;
          plVar9 = (lys_module *)(*(code *)plVar17->tpdf)(local_80,path,pcVar23,pcVar16,plVar22);
          goto LAB_0011b316;
        }
        if ((plVar9->field_0x40 & 0x80) == 0) {
          pcVar23 = plVar9->ns;
          plVar22 = local_80->ident;
          pcVar16 = (char *)0x1;
          path = (char *)plVar9->name;
          goto LAB_0011b311;
        }
        pcStack_130 = (code *)0x11b330;
        free(plVar8);
      }
      if ((*(ushort *)&plVar9->field_0x40 & 0xc0) != 0x80) {
        uVar6 = (uint)local_50;
        phVar30 = local_a8;
        goto LAB_0011be70;
      }
    }
    else {
      local_90 = (ulong)((int)uVar34 + uVar5 + 1);
      local_a0 = (lyd_node *)CONCAT71(local_a0._1_7_,plVar8->padding[(ulong)uVar5 - 0x1c] == '[');
      if (local_d0 != (lys_node *)0x0) {
        sVar19 = (size_t)uVar5;
        local_60 = plVar8;
        goto LAB_0011b271;
      }
      if (plVar17 == (lys_module *)0x0) {
        pcStack_130 = (code *)0x11c044;
        ly_vlog((ly_ctx *)local_80,LYE_INELEM_LEN,LY_VLOG_LYD,local_b0,(ulong)uVar5,plVar8);
        pcVar16 = "Instance-identifier is missing prefix in the first node.";
        ecode = LYE_SPEC;
        elem_type = LY_VLOG_PREV;
        plVar10 = (lyd_node *)0x0;
LAB_0011bfbb:
        pcStack_130 = (code *)0x11bfc2;
        ly_vlog((ly_ctx *)plVar9,ecode,elem_type,plVar10,pcVar16);
        goto LAB_0011bffd;
      }
      sVar19 = (size_t)uVar5;
      local_d0 = (lys_node *)0x0;
      plVar9 = plVar17;
      local_60 = plVar8;
    }
    plVar10 = local_40;
    uVar27 = local_50;
    if ((int)local_50 == 0) {
      pcStack_130 = (code *)0x11b35c;
      plVar10 = (lyd_node *)malloc(8);
      iVar7 = (int)path;
      if (plVar10 == (lyd_node *)0x0) {
        pcStack_130 = resolve_unres_data_item;
        resolve_instid_cold_1();
        sleaf = plVar9->ctx;
        plStack_148 = plVar17;
        phStack_140 = phVar30;
        sStack_138 = sVar19;
        if (0x3fffff < iVar7) {
          if (0xffffff < iVar7) {
            if (iVar7 == 0x1000000) {
              if (sleaf->errlist_key != 0xb) {
                pcStack_130 = (code *)&stack0xfffffffffffffff8;
                __assert_fail("sleaf->type.base == LY_TYPE_UNION",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/resolve.c"
                              ,0x202c,
                              "int resolve_unres_data_item(struct lyd_node *, enum UNRES_ITEM, int, struct lys_when **)"
                             );
              }
              pcStack_130 = (code *)&stack0xfffffffffffffff8;
              iVar7 = resolve_union((lyd_node_leaf_list *)plVar9,(lys_type *)&sleaf->errlist_key,1,
                                    ignore_fail,(lys_type **)0x0);
              return iVar7;
            }
            if (iVar7 == 0x2000000) {
              pcStack_130 = (code *)&stack0xfffffffffffffff8;
              iVar33 = lyv_data_unique((lyd_node *)plVar9);
              iVar7 = -1;
              goto joined_r0x0011c145;
            }
LAB_0011c195:
            pcStack_130 = (code *)&stack0xfffffffffffffff8;
            ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/resolve.c"
                   ,0x2048);
            return -1;
          }
          if (iVar7 == 0x400000) {
            iVar7 = 0;
          }
          else {
            if (iVar7 != 0x800000) goto LAB_0011c195;
            iVar7 = 1;
          }
          pcStack_130 = (code *)&stack0xfffffffffffffff8;
          iVar7 = resolve_must((lyd_node *)plVar9,iVar7,ignore_fail);
          iVar33 = iVar7;
joined_r0x0011c145:
          if (iVar33 == 0) {
            return 0;
          }
          return iVar7;
        }
        plStack_150 = extraout_RAX;
        if (iVar7 != 0x80000) {
          if (iVar7 != 0x100000) {
            if (iVar7 != 0x200000) goto LAB_0011c195;
            pcStack_130 = (code *)&stack0xfffffffffffffff8;
            iVar7 = resolve_when((lyd_node *)plVar9,ignore_fail,(lys_when **)pcVar16);
            iVar33 = iVar7;
            goto joined_r0x0011c145;
          }
          if (sleaf->errlist_key != 8) {
            pcStack_130 = (code *)&stack0xfffffffffffffff8;
            __assert_fail("sleaf->type.base == LY_TYPE_INST",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/resolve.c"
                          ,0x2008,
                          "int resolve_unres_data_item(struct lyd_node *, enum UNRES_ITEM, int, struct lys_when **)"
                         );
          }
          pcStack_130 = (code *)&stack0xfffffffffffffff8;
          iVar7 = check_instid_ext_dep((lys_node *)sleaf,plVar9->filepath);
          if (ignore_fail == 0) {
            iVar33 = (int)sleaf[1].dict.lock.__size[0x10];
          }
          else {
            iVar33 = -1;
            if (ignore_fail == 2 && iVar7 != 0) goto LAB_0011c280;
          }
          iVar33 = resolve_instid((lyd_node *)plVar9,plVar9->filepath,iVar33,&plStack_150);
          if (iVar33 != 0) {
            return iVar33;
          }
          if (iVar7 == 0 && plStack_150 != (lyd_node *)0x0) {
            *(lyd_node **)&plVar9->field_0x40 = plStack_150;
            plVar9->ident_size = 8;
            plVar9->tpdf_size = 0;
            plVar9->features_size = plVar9->features_size & 0xfe;
            return 0;
          }
LAB_0011c280:
          *(undefined8 *)&plVar9->field_0x40 = 0;
          plVar9->ident_size = 8;
          plVar9->tpdf_size = 0;
          plVar9->features_size = plVar9->features_size | 1;
          return 0;
        }
        if (sleaf->errlist_key != 9) {
          pcStack_130 = (code *)&stack0xfffffffffffffff8;
          __assert_fail("sleaf->type.base == LY_TYPE_LEAFREF",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/resolve.c"
                        ,0x1fe2,
                        "int resolve_unres_data_item(struct lyd_node *, enum UNRES_ITEM, int, struct lys_when **)"
                       );
        }
        if (((ulong)plVar9->name & 8) == 0) {
          pcStack_130 = (code *)&stack0xfffffffffffffff8;
          __assert_fail("leaf->validity & LYD_VAL_LEAFREF",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/resolve.c"
                        ,0x1fe3,
                        "int resolve_unres_data_item(struct lyd_node *, enum UNRES_ITEM, int, struct lys_when **)"
                       );
        }
        if (ignore_fail == 0) {
          iVar7 = (int)sleaf[1].dict.lock.__size[0x20];
LAB_0011c2a0:
          pcStack_130 = (code *)&stack0xfffffffffffffff8;
          iVar7 = resolve_leafref((lyd_node_leaf_list *)plVar9,
                                  *(char **)((long)&sleaf[1].dict.lock + 0x10),iVar7,&plStack_150);
          if (iVar7 != 0) {
            return iVar7;
          }
          if ((plStack_150 != (lyd_node *)0x0) &&
             (((plVar9->ctx->dict).lock.__size[0x11] & 8U) == 0)) {
            iVar7._0_2_ = plVar9->ident_size;
            iVar7._2_2_ = plVar9->tpdf_size;
            if (iVar7 == 2) {
              free(*(void **)&plVar9->field_0x40);
            }
            *(lyd_node **)&plVar9->field_0x40 = plStack_150;
            plVar9->ident_size = 9;
            plVar9->tpdf_size = 0;
            plVar9->features_size = plVar9->features_size & 0xfe;
            goto LAB_0011c325;
          }
        }
        else {
          iVar7 = -1;
          if ((ignore_fail != 2) ||
             (pcStack_130 = (code *)&stack0xfffffffffffffff8,
             (undefined1  [40])((undefined1  [40])(sleaf->dict).lock & (undefined1  [40])0x800) ==
             (undefined1  [40])0x0)) goto LAB_0011c2a0;
        }
        if (((plVar9->features_size & 1) == 0) &&
           (plVar15 = lyp_parse_value((lys_type *)&sleaf->errlist_key,&plVar9->filepath,
                                      (lyxml_elem *)0x0,(lyd_node_leaf_list *)plVar9,(lyd_attr *)0x0
                                      ,(lys_module *)0x0,1,0,0), plVar15 == (lys_type *)0x0)) {
          return -1;
        }
LAB_0011c325:
        *(byte *)&plVar9->name = *(byte *)&plVar9->name & 0xf7;
        return 0;
      }
      plVar10->schema = (lys_node *)0x0;
      uVar27 = 1;
    }
    plVar11 = (lyd_node *)0x0;
    plVar17 = plVar9;
    local_48 = plVar9;
    do {
      plVar8 = (&plVar10->schema)[(long)plVar11];
      plVar29 = plVar3;
      if (plVar8 == (lys_node *)0x0) {
LAB_0011b3b3:
        if (plVar29 != (lys_node *)0x0) {
          local_38 = (void *)((ulong)local_38 & 0xffffffff00000000);
          local_40 = plVar10;
          do {
            pcStack_130 = (code *)0x11b3cf;
            plVar9 = lyd_node_module((lyd_node *)plVar29);
            if (plVar9 == plVar17) {
              pcVar23 = *(char **)plVar29->name;
              pcStack_130 = (code *)0x11b3ea;
              path = (char *)local_60;
              iVar7 = strncmp(pcVar23,(char *)local_60,sVar19);
              plVar17 = local_48;
              if ((iVar7 == 0) && (pcVar23[sVar19] == '\0')) {
                if ((int)local_38 == 0) {
                  (&local_40->schema)[(long)plVar11] = plVar29;
                  local_38 = (void *)CONCAT44(local_38._4_4_,1);
                  pcVar16 = (char *)local_40;
                }
                else {
                  uVar6 = (int)uVar27 + 1;
                  path = (char *)((ulong)uVar6 * 8);
                  pcStack_130 = (code *)0x11b411;
                  local_40 = (lyd_node *)ly_realloc(local_40,(size_t)path);
                  if (local_40 == (lyd_node *)0x0) {
                    local_40 = (lyd_node *)0x0;
                    pcStack_130 = (code *)0x11be69;
                    ly_log(local_48->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                           "resolve_data");
                    phVar30 = local_a8;
                    goto LAB_0011be70;
                  }
                  (&local_40->schema)[(long)(uVar27 & 0xffffffff)] = plVar29;
                  plVar11 = (lyd_node *)(ulong)((int)plVar11 + 1);
                  local_38 = (void *)CONCAT44(local_38._4_4_,1);
                  pcVar16 = (char *)(uVar27 & 0xffffffff);
                  uVar27 = (ulong)uVar6;
                  plVar17 = local_48;
                }
              }
            }
            plVar29 = *(lys_node **)&plVar29->flags;
          } while (plVar29 != (lys_node *)0x0);
          plVar10 = local_40;
          if ((int)local_38 != 0) {
            plVar11 = (lyd_node *)(ulong)((int)plVar11 + 1);
            goto LAB_0011b4ae;
          }
        }
        uVar6 = (int)plVar11 + 1;
        uVar5 = (uint)uVar27;
        if (uVar5 < uVar6 || uVar5 - uVar6 == 0) {
          if ((int)plVar11 == 0) {
            pcStack_130 = (code *)0x11b4a8;
            free(plVar10);
            plVar10 = (lyd_node *)0x0;
          }
        }
        else {
          path = (char *)(&plVar10->schema + uVar6);
          pcStack_130 = (code *)0x11b496;
          pcVar16 = (char *)plVar11;
          memmove(&plVar10->schema + (long)plVar11,path,(ulong)(uVar5 - uVar6) << 3);
        }
        uVar27 = (ulong)(uVar5 - 1);
      }
      else {
        pcVar16 = (char *)(ulong)*(ushort *)(plVar8->name + 0x38);
        if ((*(ushort *)(plVar8->name + 0x38) & 0x802c) == 0) {
          plVar29 = plVar8->parent;
          goto LAB_0011b3b3;
        }
        plVar11 = (lyd_node *)(ulong)((int)plVar11 + 1);
      }
LAB_0011b4ae:
      phVar30 = local_a8;
      uVar6 = (uint)uVar27;
    } while ((uint)plVar11 < uVar6);
    if (uVar6 == 0) goto LAB_0011be7b;
    if ((char)local_a0 == '\0') {
      plVar11 = (lyd_node *)0x0;
      do {
        iVar7 = (int)plVar11;
        if (*(int *)((&plVar10->schema)[iVar7]->name + 0x38) == 0x10) {
          uVar6 = iVar7 + 1;
          uVar5 = (uint)uVar27;
          if (uVar5 < uVar6 || uVar5 - uVar6 == 0) {
            if (iVar7 == 0) {
              pcStack_130 = (code *)0x11bdd5;
              free(plVar10);
              plVar10 = (lyd_node *)0x0;
            }
          }
          else {
            path = (char *)(&plVar10->schema + uVar6);
            pcStack_130 = (code *)0x11bdc7;
            memmove(&plVar10->schema + (long)plVar11,path,(ulong)(uVar5 - uVar6) << 3);
            pcVar16 = (char *)plVar11;
          }
          iVar7 = iVar7 + -1;
          uVar27 = (ulong)(uVar5 - 1);
        }
        uVar34 = local_90;
        plVar11 = (lyd_node *)(ulong)(iVar7 + 1U);
      } while (iVar7 + 1U < (uint)uVar27);
      if ((uint)uVar27 == 0) {
        uVar27 = 0;
        path = (char *)0xffffffff;
        pcStack_130 = (code *)0x11be20;
        pcVar16 = (char *)local_b0;
        ly_vlog((ly_ctx *)local_80,LYE_SPEC,LY_VLOG_LYD,local_b0,
                "Instance identifier is missing list keys.");
      }
    }
    else {
      if (0 < (int)uVar6) {
        local_70 = (char *)((long)&local_a8->used + (local_90 & 0xffffffff));
        model._0_4_ = local_e8 - (int)local_90;
        pcVar16 = (char *)(ulong)(uint)model;
        plVar11 = (lyd_node *)0x0;
        local_c4 = 1;
LAB_0011b50b:
        plVar8 = (&plVar10->schema)[(int)plVar11];
        _mod_len = plVar11;
        if (plVar8 == (lys_node *)0x0) {
          pcStack_130 = (code *)0x11c07e;
          __assert_fail("pred && node && *node",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/resolve.c"
                        ,0x1176,
                        "int resolve_instid_predicate(const struct lys_module *, const char *, struct lyd_node **, int)"
                       );
        }
        local_88 = plVar17->ctx;
        local_38 = (void *)0x0;
        local_a0 = (lyd_node *)0x0;
        uVar34 = 0;
        pcVar23 = local_70;
        local_50 = uVar27;
        local_40 = plVar10;
LAB_0011b547:
        iVar7 = (int)uVar34;
        local_f8 = (lys_node *)0x0;
        uVar6 = 0;
        local_c8 = 0;
        local_e0 = (undefined1  [8])0x0;
        local_74 = 0;
        if (pcVar23[uVar34] != '[') {
LAB_0011bb35:
          uVar6 = uVar6 - iVar7;
          plVar17 = local_48;
          goto LAB_0011bb38;
        }
        local_60 = (lys_node *)CONCAT44(local_60._4_4_,iVar7);
        pcVar28 = pcVar23 + uVar34;
        pcStack_130 = (code *)0x11b586;
        local_68 = plVar8;
        ppuVar12 = __ctype_b_loc();
        plVar10 = (lyd_node *)0x1;
        uVar34 = 0;
        do {
          uVar35 = uVar34;
          pcVar16 = (char *)plVar10;
          cVar36 = pcVar28[uVar35 + 1];
          uVar34 = uVar35 + 1;
          plVar10 = (lyd_node *)((long)&((lyd_node *)pcVar16)->schema + 1);
        } while (((*ppuVar12)[cVar36] >> 0xd & 1) != 0);
        plVar8 = (lys_node *)(pcVar28 + uVar34);
        iVar33 = (int)uVar34;
        if (((*ppuVar12)[cVar36] >> 0xb & 1) == 0) {
          if (cVar36 == '.') {
            local_74 = 1;
            lVar4 = uVar35 + 2;
            uVar35 = uVar35 + 2;
            local_e0 = (undefined1  [8])plVar8;
LAB_0011b660:
            pcVar28 = pcVar28 + lVar4;
            uVar6 = (uint)uVar35;
            puVar24 = *ppuVar12;
            pcVar16 = (char *)(long)*pcVar28;
            bVar1 = *(byte *)((long)puVar24 + (long)pcVar16 * 2 + 1);
            while ((bVar1 & 0x20) != 0) {
              uVar6 = (int)uVar35 + 1;
              uVar35 = (ulong)uVar6;
              pcVar16 = (char *)(long)pcVar28[1];
              pcVar28 = pcVar28 + 1;
              bVar1 = *(byte *)((long)puVar24 + (long)pcVar16 * 2 + 1);
            }
            iVar7 = (int)local_60;
            if ((char)pcVar16 != '=') {
              uVar6 = -uVar6;
              cVar36 = true;
              path = (char *)0x0;
              local_54 = 0;
              goto LAB_0011b873;
            }
            iVar21 = -(uint)pcVar28;
            lVar18 = 0;
            lVar4 = 0;
            iVar25 = iVar21;
            do {
              lVar31 = lVar4;
              bVar1 = pcVar28[lVar31 + 1];
              iVar25 = iVar25 + -1;
              lVar18 = lVar18 + -1;
              lVar4 = lVar31 + 1;
            } while ((*(byte *)((long)puVar24 + (long)(char)bVar1 * 2 + 1) & 0x20) != 0);
            iVar33 = (int)(lVar31 + 1);
            if ((bVar1 != 0x27) && (pcVar16 = (char *)(ulong)bVar1, bVar1 != 0x22)) {
              iVar33 = uVar6 + iVar33;
              uVar27 = local_50;
              pcVar23 = local_70;
              goto LAB_0011b83d;
            }
            local_b8 = (lys_node *)(pcVar28 + lVar31 + 2);
            pcStack_130 = (code *)0x11b6ed;
            name = (char *)puVar24;
            local_98 = ppuVar12;
            pcVar13 = strchr((char *)local_b8,(int)(char)bVar1);
            pcVar23 = local_70;
            if (pcVar13 != (char *)0x0) {
              iVar7 = (int)pcVar13;
              local_54 = (~(uint)pcVar28 + iVar7) - iVar33;
              pcVar16 = (char *)(ulong)(iVar21 + iVar7 + uVar6 + 1);
              plVar29 = (lys_node *)(pcVar28 + ((iVar25 + iVar7) - lVar18) + 1);
              ppuVar12 = local_98;
              puVar24 = (ushort *)name;
              goto LAB_0011b78d;
            }
            uVar6 = ~(uVar6 + iVar33);
            uVar27 = local_50;
          }
          else {
            pcVar16 = local_e0;
            pcStack_130 = (code *)0x11b63d;
            local_98 = ppuVar12;
            uVar6 = parse_node_identifier
                              ((char *)plVar8,(char **)&local_f8,&local_c8,(char **)pcVar16,
                               &local_74,(int *)0x0,0);
            if (0 < (int)uVar6) {
              lVar4 = uVar6 + uVar34;
              uVar35 = (ulong)(uVar6 + iVar33);
              ppuVar12 = local_98;
              goto LAB_0011b660;
            }
            uVar6 = uVar6 - iVar33;
          }
          local_54 = 0;
          path = (char *)0x0;
          cVar36 = true;
          ppuVar12 = local_98;
          iVar7 = (int)local_60;
        }
        else {
          iVar7 = (int)local_60;
          local_e0 = (undefined1  [8])plVar8;
          if (cVar36 == '0') {
LAB_0011b83d:
            local_54 = 0;
            uVar6 = -iVar33;
            path = (char *)0x0;
            cVar36 = true;
          }
          else {
            puVar24 = *ppuVar12;
            if ((*(byte *)((long)puVar24 + (long)cVar36 * 2 + 1) & 8) == 0) {
              pcVar16 = (char *)(uVar34 & 0xffffffff);
              plVar29 = plVar8;
            }
            else {
              do {
                pcVar13 = pcVar28 + 1 + (long)pcVar16;
                pcVar16 = (char *)((long)&((lyd_node *)pcVar16)->schema + 1);
              } while ((*(byte *)((long)puVar24 + (long)*pcVar13 * 2 + 1) & 8) != 0);
              plVar29 = (lys_node *)(pcVar28 + (long)pcVar16);
            }
            local_74 = (((uint)model - (int)local_60) + (int)plVar29) - iVar33;
            local_b8 = (lys_node *)0x0;
            local_54 = 0;
LAB_0011b78d:
            uVar6 = (uint)pcVar16;
            cVar36 = *(char *)&plVar29->name;
            bVar1 = *(byte *)((long)puVar24 + (long)cVar36 * 2 + 1);
            while ((bVar1 & 0x20) != 0) {
              uVar6 = (int)pcVar16 + 1;
              pcVar16 = (char *)(ulong)uVar6;
              cVar36 = *(char *)((long)&plVar29->name + 1);
              plVar29 = (lys_node *)((long)&plVar29->name + 1);
              bVar1 = *(byte *)((long)puVar24 + (long)cVar36 * 2 + 1);
            }
            if (cVar36 == ']') {
              uVar6 = uVar6 + 1;
              cVar36 = *(char *)((long)&plVar29->name + 1) != '[';
            }
            else {
              uVar6 = -uVar6;
              cVar36 = true;
            }
            pcVar16 = (char *)(ulong)uVar6;
            path = (char *)local_b8;
            uVar27 = local_50;
            iVar7 = (int)local_60;
          }
        }
LAB_0011b873:
        plVar17 = local_48;
        plVar8 = local_68;
        if ((int)uVar6 < 1) goto LAB_0011bb35;
        uVar6 = uVar6 + iVar7;
        uVar34 = (ulong)uVar6;
        if (local_68 == (lys_node *)0x0) {
          plVar8 = (lys_node *)0x0;
          goto LAB_0011b9f6;
        }
        local_60 = (lys_node *)local_e0;
        if ((long)*(char *)(lys_node **)local_e0 == 0x2e) {
          LVar20 = ((lys_node *)local_68->name)->nodetype;
          if (LVar20 == LYS_LEAFLIST) {
            pcVar16 = *(char **)&local_68->nodetype;
            pcStack_130 = (code *)0x11b8b7;
            iVar7 = valequal((lys_node *)local_68->name,path,local_54,pcVar16);
            pcVar23 = local_70;
            if (iVar7 != 0) goto LAB_0011b9f6;
LAB_0011bbff:
            plVar8 = (lys_node *)0x0;
            goto LAB_0011bb28;
          }
          pcStack_130 = (code *)0x11bc4a;
          strnodetype(LVar20);
          pcVar23 = "Instance identifier expects leaf-list, but have %s \"%s\".";
          goto LAB_0011bc9c;
        }
        pcVar16 = (char *)*ppuVar12;
        if ((*(byte *)((long)&((lyd_node *)pcVar16)->schema +
                      (long)*(char *)(lys_node **)local_e0 * 2 + 1) & 8) != 0) {
          if ((lys_node *)path != (lys_node *)0x0) {
            pcStack_130 = (code *)0x11c09d;
            __assert_fail("!value",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/resolve.c"
                          ,0x1195,
                          "int resolve_instid_predicate(const struct lys_module *, const char *, struct lyd_node **, int)"
                         );
          }
          LVar20 = *(LYS_NODE *)(local_68->name + 0x38);
          if (LVar20 != LYS_LIST) goto LAB_0011bc70;
          if (*(long *)(local_68->name + 0x88) == 0) {
            pcStack_130 = (code *)0x11b9dc;
            iVar7 = atoi((char *)local_e0);
            pcVar23 = local_70;
            if (iVar7 != local_c4) goto LAB_0011bbff;
            goto LAB_0011b9f6;
          }
          pcVar23 = "Instance identifier expects list without keys, but have list \"%s\".";
          goto LAB_0011bc9c;
        }
        name = (char *)CONCAT71(name._1_7_,cVar36);
        plVar10 = (lyd_node *)local_68->name;
        LVar20 = *(LYS_NODE *)&plVar10->ht;
        local_b8 = (lys_node *)path;
        if (LVar20 != LYS_LIST) {
LAB_0011bc70:
          pcStack_130 = (code *)0x11bc75;
          strnodetype(LVar20);
          pcVar23 = "Instance identifier expects list, but have %s \"%s\".";
          goto LAB_0011bc9c;
        }
        bVar1 = *(byte *)((long)&plVar10->next + 6);
        uVar27 = (ulong)bVar1;
        pvVar14 = local_38;
        local_a0 = plVar10;
        if (local_38 != (void *)0x0) {
LAB_0011b94d:
          local_38 = pvVar14;
          if (uVar27 != 0) {
            local_98 = (ushort **)CONCAT44(local_98._4_4_,local_74);
            sVar19 = (size_t)local_74;
            uVar35 = 0;
            do {
              puVar2 = *(undefined8 **)((long)pvVar14 + uVar35 * 8);
              if (puVar2 != (undefined8 *)0x0) {
                pcVar16 = (char *)*puVar2;
                pcStack_130 = (code *)0x11b986;
                iVar7 = strncmp(pcVar16,(char *)local_60,sVar19);
                plVar17 = local_48;
                pvVar14 = local_38;
                if ((iVar7 == 0) && (pcVar16[sVar19] == '\0')) goto LAB_0011ba04;
              }
              uVar35 = uVar35 + 1;
              plVar8 = local_68;
              plVar17 = local_48;
              if (uVar27 == uVar35) break;
            } while( true );
          }
          goto LAB_0011baf3;
        }
        pcStack_130 = (code *)0x11b918;
        pvVar14 = malloc((ulong)((uint)bVar1 * 8));
        if (pvVar14 == (void *)0x0) {
          pcStack_130 = (code *)0x11bf8c;
          ly_log(local_88,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                 "resolve_instid_predicate");
          uVar6 = 0xffffffff;
          goto LAB_0011bf92;
        }
        local_38 = pvVar14;
        if (uVar27 != 0) {
          uVar35 = 0;
          do {
            *(lys_node **)((long)pvVar14 + uVar35 * 8) = (&(local_a0[1].child)->schema)[uVar35];
            uVar35 = uVar35 + 1;
          } while (uVar27 != uVar35);
          goto LAB_0011b94d;
        }
        goto LAB_0011baf3;
      }
      uVar6 = 0;
LAB_0011be2b:
      uVar34 = (ulong)(uVar6 + (int)local_90);
      phVar30 = local_a8;
    }
  } while( true );
LAB_0011ba04:
  plVar8 = local_68;
  if (uVar27 == uVar35) {
LAB_0011baf3:
    uVar27 = local_50;
    uVar6 = 0xffffffff;
    path = (char *)0xffffffff;
    pcVar16 = (char *)0x0;
    pcStack_130 = (code *)0x11bb24;
    ly_vlog(local_88,LYE_SPEC,LY_VLOG_NONE,(void *)0x0,
            "Instance identifier expects list with the key \"%.*s\", but list \"%s\" does not define it."
           );
    goto LAB_0011bb28;
  }
  plVar8 = *(lys_node **)((long)local_38 + uVar35 * 8);
  plVar9 = plVar8->module;
  if (local_f8 == (lys_node *)0x0) {
    if (plVar9 != local_48) {
      path = (char *)0xffffffff;
      pcVar16 = (char *)0x0;
      pcStack_130 = (code *)0x11bd8a;
      ly_vlog(local_88,LYE_SPEC,LY_VLOG_NONE,(void *)0x0,
              "Instance identifier expects key \"%s\" from module \"%s\", not \"%s\".");
      goto LAB_0011bc3a;
    }
  }
  else {
    pcVar16 = plVar9->name;
    sVar19 = (size_t)local_c8;
    local_60 = local_f8;
    pcStack_130 = (code *)0x11ba3f;
    iVar7 = strncmp(pcVar16,(char *)local_f8,sVar19);
    if ((iVar7 != 0) || (pcVar16[sVar19] != '\0')) {
      path = (char *)0xffffffff;
      pcVar16 = (char *)0x0;
      pcStack_130 = (code *)0x11bd3e;
      ly_vlog(local_88,LYE_SPEC,LY_VLOG_NONE,(void *)0x0,
              "Instance identifier expects key \"%s\" from module \"%.*s\", not \"%s\".");
      plVar17 = local_48;
      goto LAB_0011bc3a;
    }
  }
  plVar29 = local_68->parent;
  if (plVar29 != (lys_node *)0x0) {
    while ((lys_node *)plVar29->name != plVar8) {
      plVar29 = *(lys_node **)&plVar29->flags;
      if (plVar29 == (lys_node *)0x0) goto LAB_0011bc06;
    }
    pcVar16 = *(char **)&plVar29->nodetype;
    pcStack_130 = (code *)0x11baa2;
    path = (char *)local_b8;
    iVar7 = valequal((lys_node *)plVar29->name,(char *)local_b8,local_54,pcVar16);
    if (iVar7 == 0) {
      plVar8 = (lys_node *)0x0;
    }
    else {
      *(undefined8 *)((long)local_38 + uVar35 * 8) = 0;
      plVar8 = local_68;
    }
    uVar27 = local_50;
    plVar17 = local_48;
    pcVar23 = local_70;
    cVar36 = (char)name;
LAB_0011b9f6:
    if (cVar36 != '\0') goto LAB_0011bbb9;
    goto LAB_0011b547;
  }
LAB_0011bc06:
  path = (char *)0x0;
  pcVar16 = "Internal error (%s:%d).";
  pcStack_130 = (code *)0x11bc2c;
  ly_log(local_88,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
         "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/resolve.c"
        );
  plVar17 = local_48;
LAB_0011bc3a:
  uVar6 = 0xffffffff;
  plVar8 = local_68;
  uVar27 = local_50;
  goto LAB_0011bb28;
LAB_0011bbb9:
  if (((plVar8 != (lys_node *)0x0) && (local_38 != (void *)0x0)) &&
     (plVar10 = (lyd_node *)(ulong)*(byte *)((long)&local_a0->next + 6), plVar10 != (lyd_node *)0x0)
     ) {
    pcVar16 = (char *)0x0;
LAB_0011bbe5:
    if (*(long *)((long)local_38 + (long)pcVar16 * 8) == 0) goto code_r0x0011bbf2;
    pcVar23 = "Instance identifier is missing list key \"%s\".";
LAB_0011bc9c:
    pcVar16 = (char *)0x0;
    uVar6 = 0xffffffff;
    path = (char *)0xffffffff;
    pcStack_130 = (code *)0x11bca3;
    ly_vlog(local_88,LYE_SPEC,LY_VLOG_NONE,(void *)0x0,pcVar23);
  }
LAB_0011bb28:
  pcStack_130 = (code *)0x11bb2d;
  free(local_38);
LAB_0011bb38:
  if ((int)uVar6 < 1) {
LAB_0011bf92:
    pcVar16 = (char *)((long)&local_a8->used + (ulong)((int)local_90 - uVar6));
    ecode = LYE_INPRED;
    elem_type = LY_VLOG_LYD;
    plVar10 = local_b0;
    plVar9 = local_80;
    goto LAB_0011bfbb;
  }
  uVar5 = (int)_mod_len + 1;
  plVar11 = (lyd_node *)(ulong)uVar5;
  plVar10 = local_40;
  if (plVar8 == (lys_node *)0x0) {
    uVar26 = (uint)uVar27;
    if (uVar26 < uVar5 || uVar26 - uVar5 == 0) {
      if ((int)_mod_len == 0) {
        pcStack_130 = (code *)0x11bb94;
        free(local_40);
        plVar10 = (lyd_node *)0x0;
      }
    }
    else {
      pcVar16 = (char *)((ulong)_mod_len & 0xffffffff);
      path = (char *)(&local_40->schema + uVar5);
      pcStack_130 = (code *)0x11bb7d;
      memmove(&local_40->schema + (long)pcVar16,path,(ulong)(uVar26 - uVar5) << 3);
      plVar10 = local_40;
    }
    uVar27 = (ulong)(uVar26 - 1);
    plVar11 = _mod_len;
  }
  local_c4 = local_c4 + 1;
  if ((int)uVar27 <= (int)plVar11) goto LAB_0011be2b;
  goto LAB_0011b50b;
code_r0x0011bbf2:
  pcVar16 = (char *)((long)&((lyd_node *)pcVar16)->schema + 1);
  if (plVar10 == (lyd_node *)pcVar16) goto LAB_0011bb28;
  goto LAB_0011bbe5;
}

Assistant:

static int
resolve_instid(struct lyd_node *data, const char *path, int req_inst, struct lyd_node **ret)
{
    int i = 0, j, parsed, cur_idx;
    const struct lys_module *mod, *prev_mod = NULL;
    struct ly_ctx *ctx = data->schema->module->ctx;
    struct lyd_node *root, *node;
    const char *model = NULL, *name;
    char *str;
    int mod_len, name_len, has_predicate;
    struct unres_data node_match;

    memset(&node_match, 0, sizeof node_match);
    *ret = NULL;

    /* we need root to resolve absolute path */
    for (root = data; root->parent; root = root->parent);
    /* we're still parsing it and the pointer is not correct yet */
    if (root->prev) {
        for (; root->prev->next; root = root->prev);
    }

    /* search for the instance node */
    while (path[i]) {
        j = parse_instance_identifier(&path[i], &model, &mod_len, &name, &name_len, &has_predicate);
        if (j <= 0) {
            LOGVAL(ctx, LYE_INCHAR, LY_VLOG_LYD, data, path[i-j], &path[i-j]);
            goto error;
        }
        i += j;

        if (model) {
            str = strndup(model, mod_len);
            if (!str) {
                LOGMEM(ctx);
                goto error;
            }
            mod = ly_ctx_get_module(ctx, str, NULL, 1);
            if (ctx->data_clb) {
                if (!mod) {
                    mod = ctx->data_clb(ctx, str, NULL, 0, ctx->data_clb_data);
                } else if (!mod->implemented) {
                    mod = ctx->data_clb(ctx, mod->name, mod->ns, LY_MODCLB_NOT_IMPLEMENTED, ctx->data_clb_data);
                }
            }
            free(str);

            if (!mod || !mod->implemented || mod->disabled) {
                break;
            }
        } else if (!prev_mod) {
            /* first iteration and we are missing module name */
            LOGVAL(ctx, LYE_INELEM_LEN, LY_VLOG_LYD, data, name_len, name);
            LOGVAL(ctx, LYE_SPEC, LY_VLOG_PREV, NULL, "Instance-identifier is missing prefix in the first node.");
            goto error;
        } else {
            mod = prev_mod;
        }

        if (resolve_data(mod, name, name_len, root, &node_match)) {
            /* no instance exists */
            break;
        }

        if (has_predicate) {
            /* we have predicate, so the current results must be list or leaf-list */
            parsed = j = 0;
            /* index of the current node (for lists with position predicates) */
            cur_idx = 1;
            while (j < (signed)node_match.count) {
                node = node_match.node[j];
                parsed = resolve_instid_predicate(mod, &path[i], &node, cur_idx);
                if (parsed < 1) {
                    LOGVAL(ctx, LYE_INPRED, LY_VLOG_LYD, data, &path[i - parsed]);
                    goto error;
                }

                if (!node) {
                    /* current node does not satisfy the predicate */
                    unres_data_del(&node_match, j);
                } else {
                    ++j;
                }
                ++cur_idx;
            }

            i += parsed;
        } else if (node_match.count) {
            /* check that we are not addressing lists */
            for (j = 0; (unsigned)j < node_match.count; ++j) {
                if (node_match.node[j]->schema->nodetype == LYS_LIST) {
                    unres_data_del(&node_match, j--);
                }
            }
            if (!node_match.count) {
                LOGVAL(ctx, LYE_SPEC, LY_VLOG_LYD, data, "Instance identifier is missing list keys.");
            }
        }

        prev_mod = mod;
    }

    if (!node_match.count) {
        /* no instance exists */
        if (req_inst > -1) {
            LOGVAL(ctx, LYE_NOREQINS, LY_VLOG_LYD, data, path);
            return EXIT_FAILURE;
        }
        LOGVRB("There is no instance of \"%s\", but it is not required.", path);
        return EXIT_SUCCESS;
    } else if (node_match.count > 1) {
        /* instance identifier must resolve to a single node */
        LOGVAL(ctx, LYE_TOOMANY, LY_VLOG_LYD, data, path, "data tree");
        goto error;
    } else {
        /* we have required result, remember it and cleanup */
        *ret = node_match.node[0];
        free(node_match.node);
        return EXIT_SUCCESS;
    }

error:
    /* cleanup */
    free(node_match.node);
    return -1;
}